

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

int ecdh_sha2_nistp(LIBSSH2_SESSION *session,libssh2_curve_type type,uchar *data,size_t data_len,
                   uchar *public_key,size_t public_key_len,EVP_PKEY *private_key,
                   kmdhgGPshakex_state_t *exchange_state)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  BIGNUM *pBVar8;
  size_t sVar9;
  LIBSSH2_HOSTKEY_METHOD *pLVar10;
  uchar *puVar11;
  uchar *puVar12;
  LIBSSH2_CRYPT_METHOD *pLVar13;
  _LIBSSH2_MAC_METHOD *p_Var14;
  LIBSSH2_COMP_METHOD *pLVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  uchar *puVar19;
  size_t sVar20;
  size_t sVar21;
  EVP_MD_CTX *fingerprint_ctx;
  uint local_7c;
  size_t server_public_key_len;
  uchar *server_public_key;
  uchar *local_68;
  EVP_MD_CTX *hash;
  uchar *local_58;
  size_t local_50;
  size_t *local_48;
  uchar **local_40;
  void **local_38;
  
  if (data_len < 5) {
    iVar1 = _libssh2_error(session,-10,"Host key data is too short");
    return iVar1;
  }
  iVar1 = 0;
  switch(exchange_state->state) {
  case libssh2_NB_state_idle:
    pBVar8 = BN_new();
    exchange_state->k = (BIGNUM *)pBVar8;
    exchange_state->state = libssh2_NB_state_created;
    break;
  default:
    goto switchD_00110958_caseD_1;
  case libssh2_NB_state_created:
    break;
  case libssh2_NB_state_sent:
    goto switchD_00110958_caseD_3;
  case libssh2_NB_state_sent2:
    goto switchD_00110958_caseD_5;
  }
  local_58 = data + 1;
  local_68 = (uchar *)public_key_len;
  hash = (EVP_MD_CTX *)data;
  local_50 = data_len;
  iVar1 = _libssh2_copy_string
                    (session,(string_buf *)&hash,&session->server_hostkey,&server_public_key_len);
  if (iVar1 == 0) {
    session->server_hostkey_len = (uint32_t)server_public_key_len;
    iVar1 = _libssh2_sha1_init(&fingerprint_ctx);
    if (((iVar1 == 0) ||
        (iVar1 = _libssh2_sha1_update
                           (&fingerprint_ctx,session->server_hostkey,
                            (ulong)session->server_hostkey_len), iVar1 == 0)) ||
       (iVar1 = _libssh2_sha1_final(&fingerprint_ctx,session->server_hostkey_sha1), iVar1 == 0)) {
      iVar1 = 0;
    }
    else {
      iVar1 = 1;
    }
    session->server_hostkey_sha1_valid = iVar1;
    iVar1 = _libssh2_sha256_init(&fingerprint_ctx);
    if (((iVar1 == 0) ||
        (iVar1 = _libssh2_sha256_update
                           (&fingerprint_ctx,session->server_hostkey,
                            (ulong)session->server_hostkey_len), iVar1 == 0)) ||
       (iVar1 = _libssh2_sha256_final(&fingerprint_ctx,session->server_hostkey_sha256), iVar1 == 0))
    {
      iVar1 = 0;
    }
    else {
      iVar1 = 1;
    }
    session->server_hostkey_sha256_valid = iVar1;
    iVar1 = (*session->hostkey->init)
                      (session,session->server_hostkey,(ulong)session->server_hostkey_len,
                       &session->server_hostkey_abstract);
    if (iVar1 == 0) {
      iVar1 = _libssh2_get_string((string_buf *)&hash,&server_public_key,&server_public_key_len);
      if (iVar1 == 0) {
        local_38 = &session->server_hostkey_abstract;
        iVar1 = _libssh2_get_string((string_buf *)&hash,&exchange_state->h_sig,
                                    &exchange_state->h_sig_len);
        if (iVar1 == 0) {
          local_48 = &exchange_state->h_sig_len;
          local_40 = &exchange_state->h_sig;
          iVar1 = _libssh2_ecdh_gen_k(&exchange_state->k,private_key,
                                      (uchar *)CONCAT44(server_public_key._4_4_,
                                                        (int)server_public_key),
                                      CONCAT44(server_public_key_len._4_4_,
                                               (uint32_t)server_public_key_len));
          if (iVar1 == 0) {
            iVar1 = BN_num_bits((BIGNUM *)exchange_state->k);
            exchange_state->k_value_len = (long)((iVar1 + 7) / 8 + 5);
            uVar2 = BN_num_bits((BIGNUM *)exchange_state->k);
            sVar21 = exchange_state->k_value_len;
            if ((uVar2 & 7) != 0) {
              sVar21 = sVar21 - 1;
              exchange_state->k_value_len = sVar21;
            }
            puVar11 = (uchar *)(*session->alloc)(sVar21,&session->abstract);
            exchange_state->k_value = puVar11;
            if (puVar11 == (uchar *)0x0) {
              iVar1 = _libssh2_error(session,-6,"Unable to allocate buffer for ECDH K");
              goto switchD_00110958_caseD_1;
            }
            _libssh2_htonu32(puVar11,(int)exchange_state->k_value_len - 4);
            uVar2 = BN_num_bits((BIGNUM *)exchange_state->k);
            if ((uVar2 & 7) == 0) {
              exchange_state->k_value[4] = '\0';
              iVar1 = BN_bn2bin((BIGNUM *)exchange_state->k,exchange_state->k_value + 5);
              if (iVar1 < 1) {
                pcVar16 = "Can\'t write exchange_state->e";
                goto LAB_00110dad;
              }
            }
            else {
              iVar1 = BN_bn2bin((BIGNUM *)exchange_state->k,exchange_state->k_value + 4);
              if (iVar1 < 1) {
                pcVar16 = "Can\'t write exchange_state->k";
LAB_00110dad:
                iVar1 = -0x29;
                goto LAB_001114f7;
              }
            }
            if (type == LIBSSH2_EC_CURVE_NISTP521) {
              iVar7 = _libssh2_sha512_init(&fingerprint_ctx);
              iVar1 = -1;
              if (iVar7 != 0) {
                exchange_state->exchange_hash = &fingerprint_ctx;
                puVar12 = (session->local).banner;
                puVar11 = exchange_state->h_sig_comp;
                if (puVar12 == (uchar *)0x0) {
                  _libssh2_htonu32(puVar11,0x1a);
                  uVar2 = _libssh2_sha512_update(&fingerprint_ctx,puVar11,4);
                  pcVar16 = "SSH-2.0-libssh2_1.11.2_DEV";
                  sVar21 = 0x1a;
                }
                else {
                  sVar9 = strlen((char *)puVar12);
                  _libssh2_htonu32(puVar11,(int)sVar9 - 2);
                  uVar2 = _libssh2_sha512_update(&fingerprint_ctx,puVar11,4);
                  pcVar16 = (char *)(session->local).banner;
                  sVar9 = strlen(pcVar16);
                  sVar21 = sVar9 - 2;
                }
                uVar3 = _libssh2_sha512_update(&fingerprint_ctx,pcVar16,sVar21);
                local_7c = uVar3 & uVar2 & 1;
                sVar9 = strlen((char *)(session->remote).banner);
                _libssh2_htonu32(puVar11,(uint32_t)sVar9);
                uVar2 = _libssh2_sha512_update(&fingerprint_ctx,puVar11,4);
                puVar12 = (session->remote).banner;
                sVar9 = strlen((char *)puVar12);
                uVar3 = _libssh2_sha512_update(&fingerprint_ctx,puVar12,sVar9);
                _libssh2_htonu32(puVar11,(uint32_t)(session->local).kexinit_len);
                uVar4 = _libssh2_sha512_update(&fingerprint_ctx,puVar11,4);
                uVar5 = _libssh2_sha512_update
                                  (&fingerprint_ctx,(session->local).kexinit,
                                   (session->local).kexinit_len);
                local_7c = uVar5 & uVar4 & uVar3 & uVar2 & local_7c;
                _libssh2_htonu32(puVar11,(uint32_t)(session->remote).kexinit_len);
                uVar2 = _libssh2_sha512_update(&fingerprint_ctx,puVar11,4);
                uVar3 = _libssh2_sha512_update
                                  (&fingerprint_ctx,(session->remote).kexinit,
                                   (session->remote).kexinit_len);
                _libssh2_htonu32(puVar11,session->server_hostkey_len);
                uVar4 = _libssh2_sha512_update(&fingerprint_ctx,puVar11,4);
                uVar5 = _libssh2_sha512_update
                                  (&fingerprint_ctx,session->server_hostkey,
                                   (ulong)session->server_hostkey_len);
                puVar12 = local_68;
                _libssh2_htonu32(puVar11,(uint32_t)local_68);
                uVar6 = _libssh2_sha512_update(&fingerprint_ctx,puVar11,4);
                uVar6 = uVar6 & uVar5 & uVar4 & uVar3 & uVar2 & local_7c;
                uVar2 = _libssh2_sha512_update(&fingerprint_ctx,public_key,(size_t)puVar12);
                _libssh2_htonu32(puVar11,(uint32_t)server_public_key_len);
                uVar3 = _libssh2_sha512_update(&fingerprint_ctx,puVar11,4);
                uVar4 = _libssh2_sha512_update
                                  (&fingerprint_ctx,
                                   (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                                   CONCAT44(server_public_key_len._4_4_,
                                            (uint32_t)server_public_key_len));
                uVar5 = _libssh2_sha512_update
                                  (&fingerprint_ctx,exchange_state->k_value,
                                   exchange_state->k_value_len);
                if ((uVar4 & uVar3 & uVar2 & uVar6 & uVar5) == 0) {
LAB_00111409:
                  iVar1 = -1;
                }
                else {
                  iVar7 = _libssh2_sha512_final(&fingerprint_ctx,puVar11);
                  iVar1 = -1;
                  if (iVar7 != 0) {
                    pLVar10 = session->hostkey;
                    puVar11 = *local_40;
                    sVar21 = *local_48;
                    sVar20 = 0x40;
LAB_001113f9:
                    iVar1 = (*pLVar10->sig_verify)
                                      (session,puVar11,sVar21,exchange_state->h_sig_comp,sVar20,
                                       local_38);
                    iVar1 = -(uint)(iVar1 != 0);
                  }
                }
              }
LAB_0011140c:
              if (iVar1 != 0) {
                pcVar16 = "Unable to verify hostkey signature ECDH";
                iVar1 = -0xb;
                goto LAB_001114f7;
              }
            }
            else {
              if (type == LIBSSH2_EC_CURVE_NISTP384) {
                iVar7 = _libssh2_sha384_init(&fingerprint_ctx);
                iVar1 = -1;
                if (iVar7 != 0) {
                  exchange_state->exchange_hash = &fingerprint_ctx;
                  puVar12 = (session->local).banner;
                  puVar11 = exchange_state->h_sig_comp;
                  if (puVar12 == (uchar *)0x0) {
                    _libssh2_htonu32(puVar11,0x1a);
                    uVar2 = _libssh2_sha384_update(&fingerprint_ctx,puVar11,4);
                    pcVar16 = "SSH-2.0-libssh2_1.11.2_DEV";
                    sVar21 = 0x1a;
                  }
                  else {
                    sVar9 = strlen((char *)puVar12);
                    _libssh2_htonu32(puVar11,(int)sVar9 - 2);
                    uVar2 = _libssh2_sha384_update(&fingerprint_ctx,puVar11,4);
                    pcVar16 = (char *)(session->local).banner;
                    sVar9 = strlen(pcVar16);
                    sVar21 = sVar9 - 2;
                  }
                  uVar3 = _libssh2_sha384_update(&fingerprint_ctx,pcVar16,sVar21);
                  local_7c = uVar3 & uVar2 & 1;
                  sVar9 = strlen((char *)(session->remote).banner);
                  _libssh2_htonu32(puVar11,(uint32_t)sVar9);
                  uVar2 = _libssh2_sha384_update(&fingerprint_ctx,puVar11,4);
                  puVar12 = (session->remote).banner;
                  sVar9 = strlen((char *)puVar12);
                  uVar3 = _libssh2_sha384_update(&fingerprint_ctx,puVar12,sVar9);
                  _libssh2_htonu32(puVar11,(uint32_t)(session->local).kexinit_len);
                  uVar4 = _libssh2_sha384_update(&fingerprint_ctx,puVar11,4);
                  uVar5 = _libssh2_sha384_update
                                    (&fingerprint_ctx,(session->local).kexinit,
                                     (session->local).kexinit_len);
                  local_7c = uVar5 & uVar4 & uVar3 & uVar2 & local_7c;
                  _libssh2_htonu32(puVar11,(uint32_t)(session->remote).kexinit_len);
                  uVar2 = _libssh2_sha384_update(&fingerprint_ctx,puVar11,4);
                  uVar3 = _libssh2_sha384_update
                                    (&fingerprint_ctx,(session->remote).kexinit,
                                     (session->remote).kexinit_len);
                  _libssh2_htonu32(puVar11,session->server_hostkey_len);
                  uVar4 = _libssh2_sha384_update(&fingerprint_ctx,puVar11,4);
                  uVar5 = _libssh2_sha384_update
                                    (&fingerprint_ctx,session->server_hostkey,
                                     (ulong)session->server_hostkey_len);
                  puVar12 = local_68;
                  _libssh2_htonu32(puVar11,(uint32_t)local_68);
                  uVar6 = _libssh2_sha384_update(&fingerprint_ctx,puVar11,4);
                  uVar6 = uVar6 & uVar5 & uVar4 & uVar3 & uVar2 & local_7c;
                  uVar2 = _libssh2_sha384_update(&fingerprint_ctx,public_key,(size_t)puVar12);
                  _libssh2_htonu32(puVar11,(uint32_t)server_public_key_len);
                  uVar3 = _libssh2_sha384_update(&fingerprint_ctx,puVar11,4);
                  uVar4 = _libssh2_sha384_update
                                    (&fingerprint_ctx,
                                     (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key
                                                     ),
                                     CONCAT44(server_public_key_len._4_4_,
                                              (uint32_t)server_public_key_len));
                  uVar5 = _libssh2_sha384_update
                                    (&fingerprint_ctx,exchange_state->k_value,
                                     exchange_state->k_value_len);
                  if ((uVar4 & uVar3 & uVar2 & uVar6 & uVar5) == 0) goto LAB_00111409;
                  iVar7 = _libssh2_sha384_final(&fingerprint_ctx,puVar11);
                  iVar1 = -1;
                  if (iVar7 != 0) {
                    pLVar10 = session->hostkey;
                    puVar11 = *local_40;
                    sVar21 = *local_48;
                    sVar20 = 0x30;
                    goto LAB_001113f9;
                  }
                }
                goto LAB_0011140c;
              }
              if (type == LIBSSH2_EC_CURVE_NISTP256) {
                iVar7 = _libssh2_sha256_init(&fingerprint_ctx);
                iVar1 = -1;
                if (iVar7 != 0) {
                  exchange_state->exchange_hash = &fingerprint_ctx;
                  puVar12 = (session->local).banner;
                  puVar11 = exchange_state->h_sig_comp;
                  if (puVar12 == (uchar *)0x0) {
                    _libssh2_htonu32(puVar11,0x1a);
                    uVar2 = _libssh2_sha256_update(&fingerprint_ctx,puVar11,4);
                    pcVar16 = "SSH-2.0-libssh2_1.11.2_DEV";
                    sVar21 = 0x1a;
                  }
                  else {
                    sVar9 = strlen((char *)puVar12);
                    _libssh2_htonu32(puVar11,(int)sVar9 - 2);
                    uVar2 = _libssh2_sha256_update(&fingerprint_ctx,puVar11,4);
                    pcVar16 = (char *)(session->local).banner;
                    sVar9 = strlen(pcVar16);
                    sVar21 = sVar9 - 2;
                  }
                  uVar3 = _libssh2_sha256_update(&fingerprint_ctx,pcVar16,sVar21);
                  local_7c = uVar3 & uVar2 & 1;
                  sVar9 = strlen((char *)(session->remote).banner);
                  _libssh2_htonu32(puVar11,(uint32_t)sVar9);
                  uVar2 = _libssh2_sha256_update(&fingerprint_ctx,puVar11,4);
                  puVar12 = (session->remote).banner;
                  sVar9 = strlen((char *)puVar12);
                  uVar3 = _libssh2_sha256_update(&fingerprint_ctx,puVar12,sVar9);
                  _libssh2_htonu32(puVar11,(uint32_t)(session->local).kexinit_len);
                  uVar4 = _libssh2_sha256_update(&fingerprint_ctx,puVar11,4);
                  uVar5 = _libssh2_sha256_update
                                    (&fingerprint_ctx,(session->local).kexinit,
                                     (session->local).kexinit_len);
                  local_7c = uVar5 & uVar4 & uVar3 & uVar2 & local_7c;
                  _libssh2_htonu32(puVar11,(uint32_t)(session->remote).kexinit_len);
                  uVar2 = _libssh2_sha256_update(&fingerprint_ctx,puVar11,4);
                  uVar3 = _libssh2_sha256_update
                                    (&fingerprint_ctx,(session->remote).kexinit,
                                     (session->remote).kexinit_len);
                  _libssh2_htonu32(puVar11,session->server_hostkey_len);
                  uVar4 = _libssh2_sha256_update(&fingerprint_ctx,puVar11,4);
                  uVar5 = _libssh2_sha256_update
                                    (&fingerprint_ctx,session->server_hostkey,
                                     (ulong)session->server_hostkey_len);
                  puVar12 = local_68;
                  _libssh2_htonu32(puVar11,(uint32_t)local_68);
                  uVar6 = _libssh2_sha256_update(&fingerprint_ctx,puVar11,4);
                  uVar6 = uVar6 & uVar5 & uVar4 & uVar3 & uVar2 & local_7c;
                  uVar2 = _libssh2_sha256_update(&fingerprint_ctx,public_key,(size_t)puVar12);
                  _libssh2_htonu32(puVar11,(uint32_t)server_public_key_len);
                  uVar3 = _libssh2_sha256_update(&fingerprint_ctx,puVar11,4);
                  uVar4 = _libssh2_sha256_update
                                    (&fingerprint_ctx,
                                     (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key
                                                     ),
                                     CONCAT44(server_public_key_len._4_4_,
                                              (uint32_t)server_public_key_len));
                  uVar5 = _libssh2_sha256_update
                                    (&fingerprint_ctx,exchange_state->k_value,
                                     exchange_state->k_value_len);
                  if ((uVar4 & uVar3 & uVar2 & uVar6 & uVar5) == 0) goto LAB_00111409;
                  iVar7 = _libssh2_sha256_final(&fingerprint_ctx,puVar11);
                  iVar1 = -1;
                  if (iVar7 != 0) {
                    pLVar10 = session->hostkey;
                    puVar11 = *local_40;
                    sVar21 = *local_48;
                    sVar20 = 0x20;
                    goto LAB_001113f9;
                  }
                }
                goto LAB_0011140c;
              }
            }
            exchange_state->c = '\x15';
            exchange_state->state = libssh2_NB_state_sent;
switchD_00110958_caseD_3:
            iVar1 = _libssh2_transport_send(session,&exchange_state->c,1,(uchar *)0x0,0);
            if (iVar1 == -0x25) {
              return -0x25;
            }
            if (iVar1 == 0) {
              exchange_state->state = libssh2_NB_state_sent2;
switchD_00110958_caseD_5:
              iVar1 = _libssh2_packet_require
                                (session,'\x15',&exchange_state->tmp,&exchange_state->tmp_len,0,
                                 (uchar *)0x0,0,&exchange_state->req_state);
              if (iVar1 == -0x25) {
                return -0x25;
              }
              if (iVar1 == 0) {
                *(byte *)&session->state = (byte)session->state | 4;
                (*session->free)(exchange_state->tmp,&session->abstract);
                if (session->session_id == (uchar *)0x0) {
                  if (type == LIBSSH2_EC_CURVE_NISTP256) {
                    sVar21 = 0x20;
                  }
                  else if (type == LIBSSH2_EC_CURVE_NISTP521) {
                    sVar21 = 0x40;
                  }
                  else {
                    if (type != LIBSSH2_EC_CURVE_NISTP384) {
                      pcVar16 = "Unknown SHA digest for EC curve";
                      iVar1 = -5;
                      goto LAB_001114f7;
                    }
                    sVar21 = 0x30;
                  }
                  puVar11 = (uchar *)(*session->alloc)(sVar21,&session->abstract);
                  session->session_id = puVar11;
                  if (puVar11 == (uchar *)0x0) {
                    pcVar16 = "Unable to allocate buffer for SHA digest";
                    goto LAB_001109ad;
                  }
                  memcpy(puVar11,exchange_state->h_sig_comp,sVar21);
                  session->session_id_len = (uint32_t)sVar21;
                }
                pLVar13 = (session->local).crypt;
                if (pLVar13->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                  (*pLVar13->dtor)(session,&(session->local).crypt_abstract);
                  pLVar13 = (session->local).crypt;
                }
                if (pLVar13->init ==
                    (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
                     *)0x0) {
LAB_00111c30:
                  pLVar13 = (session->remote).crypt;
                  if (pLVar13->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                    (*pLVar13->dtor)(session,&(session->remote).crypt_abstract);
                    pLVar13 = (session->remote).crypt;
                  }
                  if (pLVar13->init !=
                      (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
                       *)0x0) {
                    server_public_key._0_4_ = 0;
                    server_public_key_len._0_4_ = 0;
                    if (type == LIBSSH2_EC_CURVE_NISTP256) {
                      puVar11 = (uchar *)(*session->alloc)((long)pLVar13->iv_len + 0x20,
                                                           &session->abstract);
                      if (puVar11 == (uchar *)0x0) goto LAB_00111f4e;
                      uVar18 = 0;
                      do {
                        if ((ulong)(long)((session->remote).crypt)->iv_len <= uVar18)
                        goto LAB_00111f51;
                        iVar1 = _libssh2_sha256_init(&hash);
                        if (((iVar1 == 0) ||
                            (iVar1 = _libssh2_sha256_update
                                               (&hash,exchange_state->k_value,
                                                exchange_state->k_value_len), iVar1 == 0)) ||
                           (iVar1 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20),
                           iVar1 == 0)) break;
                        uVar17 = uVar18;
                        puVar12 = puVar11;
                        if (uVar18 == 0) {
                          iVar1 = _libssh2_sha256_update(&hash,"B",1);
                          if (iVar1 == 0) break;
                          uVar17 = (ulong)session->session_id_len;
                          puVar12 = session->session_id;
                        }
                        iVar1 = _libssh2_sha256_update(&hash,puVar12,uVar17);
                        if (iVar1 == 0) break;
                        iVar1 = _libssh2_sha256_final(&hash,puVar11 + uVar18);
                        uVar18 = uVar18 + 0x20;
                      } while (iVar1 != 0);
LAB_00111f3c:
                      (*session->free)(puVar11,&session->abstract);
                      puVar11 = (uchar *)0x0;
LAB_00111f51:
                      if (puVar11 != (uchar *)0x0) {
                        if (type == LIBSSH2_EC_CURVE_NISTP256) {
                          puVar12 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->
                                                                     secret_len + 0x20,
                                                               &session->abstract);
                          if (puVar12 == (uchar *)0x0) goto LAB_00112246;
                          uVar18 = 0;
                          do {
                            if ((ulong)(long)((session->remote).crypt)->secret_len <= uVar18)
                            goto LAB_00112249;
                            iVar1 = _libssh2_sha256_init(&hash);
                            if (((iVar1 == 0) ||
                                (iVar1 = _libssh2_sha256_update
                                                   (&hash,exchange_state->k_value,
                                                    exchange_state->k_value_len), iVar1 == 0)) ||
                               (iVar1 = _libssh2_sha256_update
                                                  (&hash,exchange_state->h_sig_comp,0x20),
                               iVar1 == 0)) break;
                            uVar17 = uVar18;
                            puVar19 = puVar12;
                            if (uVar18 == 0) {
                              iVar1 = _libssh2_sha256_update(&hash,"D",1);
                              if (iVar1 == 0) break;
                              uVar17 = (ulong)session->session_id_len;
                              puVar19 = session->session_id;
                            }
                            iVar1 = _libssh2_sha256_update(&hash,puVar19,uVar17);
                            if (iVar1 == 0) break;
                            iVar1 = _libssh2_sha256_final(&hash,puVar12 + uVar18);
                            uVar18 = uVar18 + 0x20;
                          } while (iVar1 != 0);
LAB_00112234:
                          (*session->free)(puVar12,&session->abstract);
                          puVar12 = (uchar *)0x0;
LAB_00112249:
                          if (puVar12 != (uchar *)0x0) {
                            pLVar13 = (session->remote).crypt;
                            iVar1 = (*pLVar13->init)(session,pLVar13,puVar11,
                                                     (int *)&server_public_key,puVar12,
                                                     (int *)&server_public_key_len,0,
                                                     &(session->remote).crypt_abstract);
                            if (iVar1 == 0) {
                              if ((int)server_public_key != 0) {
                                explicit_bzero(puVar11,(long)((session->remote).crypt)->iv_len);
                                (*session->free)(puVar11,&session->abstract);
                              }
                              if ((uint32_t)server_public_key_len != 0) {
                                explicit_bzero(puVar12,(long)((session->remote).crypt)->secret_len);
                                (*session->free)(puVar12,&session->abstract);
                              }
                              goto LAB_001122e3;
                            }
                            (*session->free)(puVar11,&session->abstract);
                            puVar11 = puVar12;
                          }
                        }
                        else {
                          if (type == LIBSSH2_EC_CURVE_NISTP521) {
                            puVar12 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->
                                                                       secret_len + 0x40,
                                                                 &session->abstract);
                            if (puVar12 != (uchar *)0x0) {
                              uVar18 = 0;
                              do {
                                if ((ulong)(long)((session->remote).crypt)->secret_len <= uVar18)
                                goto LAB_00112249;
                                iVar1 = _libssh2_sha512_init(&hash);
                                if (((iVar1 == 0) ||
                                    (iVar1 = _libssh2_sha512_update
                                                       (&hash,exchange_state->k_value,
                                                        exchange_state->k_value_len), iVar1 == 0))
                                   || (iVar1 = _libssh2_sha512_update
                                                         (&hash,exchange_state->h_sig_comp,0x40),
                                      iVar1 == 0)) break;
                                uVar17 = uVar18;
                                puVar19 = puVar12;
                                if (uVar18 == 0) {
                                  iVar1 = _libssh2_sha512_update(&hash,"D",1);
                                  if (iVar1 == 0) break;
                                  uVar17 = (ulong)session->session_id_len;
                                  puVar19 = session->session_id;
                                }
                                iVar1 = _libssh2_sha512_update(&hash,puVar19,uVar17);
                                if (iVar1 == 0) break;
                                iVar1 = _libssh2_sha512_final(&hash,puVar12 + uVar18);
                                uVar18 = uVar18 + 0x40;
                              } while (iVar1 != 0);
                              goto LAB_00112234;
                            }
LAB_00112246:
                            puVar12 = (uchar *)0x0;
                            goto LAB_00112249;
                          }
                          if (type == LIBSSH2_EC_CURVE_NISTP384) {
                            puVar12 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->
                                                                       secret_len + 0x30,
                                                                 &session->abstract);
                            if (puVar12 != (uchar *)0x0) {
                              uVar18 = 0;
                              do {
                                if ((ulong)(long)((session->remote).crypt)->secret_len <= uVar18)
                                goto LAB_00112249;
                                iVar1 = _libssh2_sha384_init(&hash);
                                if (((iVar1 == 0) ||
                                    (iVar1 = _libssh2_sha384_update
                                                       (&hash,exchange_state->k_value,
                                                        exchange_state->k_value_len), iVar1 == 0))
                                   || (iVar1 = _libssh2_sha384_update
                                                         (&hash,exchange_state->h_sig_comp,0x30),
                                      iVar1 == 0)) break;
                                uVar17 = uVar18;
                                puVar19 = puVar12;
                                if (uVar18 == 0) {
                                  iVar1 = _libssh2_sha384_update(&hash,"D",1);
                                  if (iVar1 == 0) break;
                                  uVar17 = (ulong)session->session_id_len;
                                  puVar19 = session->session_id;
                                }
                                iVar1 = _libssh2_sha384_update(&hash,puVar19,uVar17);
                                if (iVar1 == 0) break;
                                iVar1 = _libssh2_sha384_final(&hash,puVar12 + uVar18);
                                uVar18 = uVar18 + 0x30;
                              } while (iVar1 != 0);
                              goto LAB_00112234;
                            }
                            goto LAB_00112246;
                          }
                        }
                        (*session->free)(puVar11,&session->abstract);
                      }
                    }
                    else {
                      if (type == LIBSSH2_EC_CURVE_NISTP521) {
                        puVar11 = (uchar *)(*session->alloc)((long)pLVar13->iv_len + 0x40,
                                                             &session->abstract);
                        if (puVar11 != (uchar *)0x0) {
                          uVar18 = 0;
                          do {
                            if ((ulong)(long)((session->remote).crypt)->iv_len <= uVar18)
                            goto LAB_00111f51;
                            iVar1 = _libssh2_sha512_init(&hash);
                            if (((iVar1 == 0) ||
                                (iVar1 = _libssh2_sha512_update
                                                   (&hash,exchange_state->k_value,
                                                    exchange_state->k_value_len), iVar1 == 0)) ||
                               (iVar1 = _libssh2_sha512_update
                                                  (&hash,exchange_state->h_sig_comp,0x40),
                               iVar1 == 0)) break;
                            uVar17 = uVar18;
                            puVar12 = puVar11;
                            if (uVar18 == 0) {
                              iVar1 = _libssh2_sha512_update(&hash,"B",1);
                              if (iVar1 == 0) break;
                              uVar17 = (ulong)session->session_id_len;
                              puVar12 = session->session_id;
                            }
                            iVar1 = _libssh2_sha512_update(&hash,puVar12,uVar17);
                            if (iVar1 == 0) break;
                            iVar1 = _libssh2_sha512_final(&hash,puVar11 + uVar18);
                            uVar18 = uVar18 + 0x40;
                          } while (iVar1 != 0);
                          goto LAB_00111f3c;
                        }
LAB_00111f4e:
                        puVar11 = (uchar *)0x0;
                        goto LAB_00111f51;
                      }
                      if (type == LIBSSH2_EC_CURVE_NISTP384) {
                        puVar11 = (uchar *)(*session->alloc)((long)pLVar13->iv_len + 0x30,
                                                             &session->abstract);
                        if (puVar11 != (uchar *)0x0) {
                          uVar18 = 0;
                          do {
                            if ((ulong)(long)((session->remote).crypt)->iv_len <= uVar18)
                            goto LAB_00111f51;
                            iVar1 = _libssh2_sha384_init(&hash);
                            if (((iVar1 == 0) ||
                                (iVar1 = _libssh2_sha384_update
                                                   (&hash,exchange_state->k_value,
                                                    exchange_state->k_value_len), iVar1 == 0)) ||
                               (iVar1 = _libssh2_sha384_update
                                                  (&hash,exchange_state->h_sig_comp,0x30),
                               iVar1 == 0)) break;
                            uVar17 = uVar18;
                            puVar12 = puVar11;
                            if (uVar18 == 0) {
                              iVar1 = _libssh2_sha384_update(&hash,"B",1);
                              if (iVar1 == 0) break;
                              uVar17 = (ulong)session->session_id_len;
                              puVar12 = session->session_id;
                            }
                            iVar1 = _libssh2_sha384_update(&hash,puVar12,uVar17);
                            if (iVar1 == 0) break;
                            iVar1 = _libssh2_sha384_final(&hash,puVar11 + uVar18);
                            uVar18 = uVar18 + 0x30;
                          } while (iVar1 != 0);
                          goto LAB_00111f3c;
                        }
                        goto LAB_00111f4e;
                      }
                    }
LAB_00112a7c:
                    iVar1 = -5;
                    goto switchD_00110958_caseD_1;
                  }
LAB_001122e3:
                  p_Var14 = (session->local).mac;
                  if (p_Var14->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                    (*p_Var14->dtor)(session,&(session->local).mac_abstract);
                    p_Var14 = (session->local).mac;
                  }
                  if (p_Var14->init !=
                      (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
                    server_public_key._0_4_ = 0;
                    if (type == LIBSSH2_EC_CURVE_NISTP521) {
                      puVar11 = (uchar *)(*session->alloc)((long)p_Var14->key_len + 0x40,
                                                           &session->abstract);
                      if (puVar11 != (uchar *)0x0) {
                        uVar18 = 0;
                        do {
                          if ((ulong)(long)((session->local).mac)->key_len <= uVar18)
                          goto LAB_001125ff;
                          iVar1 = _libssh2_sha512_init(&hash);
                          if (((iVar1 == 0) ||
                              (iVar1 = _libssh2_sha512_update
                                                 (&hash,exchange_state->k_value,
                                                  exchange_state->k_value_len), iVar1 == 0)) ||
                             (iVar1 = _libssh2_sha512_update(&hash,exchange_state->h_sig_comp,0x40),
                             iVar1 == 0)) break;
                          uVar17 = uVar18;
                          puVar12 = puVar11;
                          if (uVar18 == 0) {
                            iVar1 = _libssh2_sha512_update(&hash,"E",1);
                            if (iVar1 == 0) break;
                            uVar17 = (ulong)session->session_id_len;
                            puVar12 = session->session_id;
                          }
                          iVar1 = _libssh2_sha512_update(&hash,puVar12,uVar17);
                          if (iVar1 == 0) break;
                          iVar1 = _libssh2_sha512_final(&hash,puVar11 + uVar18);
                          uVar18 = uVar18 + 0x40;
                        } while (iVar1 != 0);
                        goto LAB_001125ea;
                      }
LAB_001125fc:
                      puVar11 = (uchar *)0x0;
                    }
                    else {
                      if (type == LIBSSH2_EC_CURVE_NISTP384) {
                        puVar11 = (uchar *)(*session->alloc)((long)p_Var14->key_len + 0x30,
                                                             &session->abstract);
                        if (puVar11 == (uchar *)0x0) goto LAB_001125fc;
                        uVar18 = 0;
                        do {
                          if ((ulong)(long)((session->local).mac)->key_len <= uVar18)
                          goto LAB_001125ff;
                          iVar1 = _libssh2_sha384_init(&hash);
                          if (((iVar1 == 0) ||
                              (iVar1 = _libssh2_sha384_update
                                                 (&hash,exchange_state->k_value,
                                                  exchange_state->k_value_len), iVar1 == 0)) ||
                             (iVar1 = _libssh2_sha384_update(&hash,exchange_state->h_sig_comp,0x30),
                             iVar1 == 0)) break;
                          uVar17 = uVar18;
                          puVar12 = puVar11;
                          if (uVar18 == 0) {
                            iVar1 = _libssh2_sha384_update(&hash,"E",1);
                            if (iVar1 == 0) break;
                            uVar17 = (ulong)session->session_id_len;
                            puVar12 = session->session_id;
                          }
                          iVar1 = _libssh2_sha384_update(&hash,puVar12,uVar17);
                          if (iVar1 == 0) break;
                          iVar1 = _libssh2_sha384_final(&hash,puVar11 + uVar18);
                          uVar18 = uVar18 + 0x30;
                        } while (iVar1 != 0);
                      }
                      else {
                        if (type != LIBSSH2_EC_CURVE_NISTP256) goto LAB_00112a7c;
                        puVar11 = (uchar *)(*session->alloc)((long)p_Var14->key_len + 0x20,
                                                             &session->abstract);
                        if (puVar11 == (uchar *)0x0) goto LAB_001125fc;
                        uVar18 = 0;
                        do {
                          if ((ulong)(long)((session->local).mac)->key_len <= uVar18)
                          goto LAB_001125ff;
                          iVar1 = _libssh2_sha256_init(&hash);
                          if (((iVar1 == 0) ||
                              (iVar1 = _libssh2_sha256_update
                                                 (&hash,exchange_state->k_value,
                                                  exchange_state->k_value_len), iVar1 == 0)) ||
                             (iVar1 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20),
                             iVar1 == 0)) break;
                          uVar17 = uVar18;
                          puVar12 = puVar11;
                          if (uVar18 == 0) {
                            iVar1 = _libssh2_sha256_update(&hash,"E",1);
                            if (iVar1 == 0) break;
                            uVar17 = (ulong)session->session_id_len;
                            puVar12 = session->session_id;
                          }
                          iVar1 = _libssh2_sha256_update(&hash,puVar12,uVar17);
                          if (iVar1 == 0) break;
                          iVar1 = _libssh2_sha256_final(&hash,puVar11 + uVar18);
                          uVar18 = uVar18 + 0x20;
                        } while (iVar1 != 0);
                      }
LAB_001125ea:
                      (*session->free)(puVar11,&session->abstract);
                      puVar11 = (uchar *)0x0;
                    }
LAB_001125ff:
                    if (puVar11 == (uchar *)0x0) goto LAB_00112a7c;
                    (*((session->local).mac)->init)
                              (session,puVar11,(int *)&server_public_key,
                               &(session->local).mac_abstract);
                    if ((int)server_public_key != 0) {
                      explicit_bzero(puVar11,(long)((session->local).mac)->key_len);
                      (*session->free)(puVar11,&session->abstract);
                    }
                  }
                  p_Var14 = (session->remote).mac;
                  if (p_Var14->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                    (*p_Var14->dtor)(session,&(session->remote).mac_abstract);
                    p_Var14 = (session->remote).mac;
                  }
                  if (p_Var14->init !=
                      (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
                    server_public_key._0_4_ = 0;
                    if (type == LIBSSH2_EC_CURVE_NISTP521) {
                      puVar11 = (uchar *)(*session->alloc)((long)p_Var14->key_len + 0x40,
                                                           &session->abstract);
                      if (puVar11 != (uchar *)0x0) {
                        uVar18 = 0;
                        do {
                          if ((ulong)(long)((session->remote).mac)->key_len <= uVar18)
                          goto LAB_00112960;
                          iVar1 = _libssh2_sha512_init(&hash);
                          if (((iVar1 == 0) ||
                              (iVar1 = _libssh2_sha512_update
                                                 (&hash,exchange_state->k_value,
                                                  exchange_state->k_value_len), iVar1 == 0)) ||
                             (iVar1 = _libssh2_sha512_update(&hash,exchange_state->h_sig_comp,0x40),
                             iVar1 == 0)) break;
                          uVar17 = uVar18;
                          puVar12 = puVar11;
                          if (uVar18 == 0) {
                            iVar1 = _libssh2_sha512_update(&hash,"F",1);
                            if (iVar1 == 0) break;
                            uVar17 = (ulong)session->session_id_len;
                            puVar12 = session->session_id;
                          }
                          iVar1 = _libssh2_sha512_update(&hash,puVar12,uVar17);
                          if (iVar1 == 0) break;
                          iVar1 = _libssh2_sha512_final(&hash,puVar11 + uVar18);
                          uVar18 = uVar18 + 0x40;
                        } while (iVar1 != 0);
LAB_00112954:
                        (*session->free)(puVar11,&session->abstract);
                      }
                    }
                    else if (type == LIBSSH2_EC_CURVE_NISTP384) {
                      puVar11 = (uchar *)(*session->alloc)((long)p_Var14->key_len + 0x30,
                                                           &session->abstract);
                      if (puVar11 != (uchar *)0x0) {
                        uVar18 = 0;
                        do {
                          if ((ulong)(long)((session->remote).mac)->key_len <= uVar18)
                          goto LAB_00112960;
                          iVar1 = _libssh2_sha384_init(&hash);
                          if (((iVar1 == 0) ||
                              (iVar1 = _libssh2_sha384_update
                                                 (&hash,exchange_state->k_value,
                                                  exchange_state->k_value_len), iVar1 == 0)) ||
                             (iVar1 = _libssh2_sha384_update(&hash,exchange_state->h_sig_comp,0x30),
                             iVar1 == 0)) break;
                          uVar17 = uVar18;
                          puVar12 = puVar11;
                          if (uVar18 == 0) {
                            iVar1 = _libssh2_sha384_update(&hash,"F",1);
                            if (iVar1 == 0) break;
                            uVar17 = (ulong)session->session_id_len;
                            puVar12 = session->session_id;
                          }
                          iVar1 = _libssh2_sha384_update(&hash,puVar12,uVar17);
                          if (iVar1 == 0) break;
                          iVar1 = _libssh2_sha384_final(&hash,puVar11 + uVar18);
                          uVar18 = uVar18 + 0x30;
                        } while (iVar1 != 0);
                        goto LAB_00112954;
                      }
                    }
                    else {
                      if (type != LIBSSH2_EC_CURVE_NISTP256) goto LAB_00112a7c;
                      puVar11 = (uchar *)(*session->alloc)((long)p_Var14->key_len + 0x20,
                                                           &session->abstract);
                      if (puVar11 != (uchar *)0x0) {
                        uVar18 = 0;
                        do {
                          if ((ulong)(long)((session->remote).mac)->key_len <= uVar18)
                          goto LAB_00112960;
                          iVar1 = _libssh2_sha256_init(&hash);
                          if (((iVar1 == 0) ||
                              (iVar1 = _libssh2_sha256_update
                                                 (&hash,exchange_state->k_value,
                                                  exchange_state->k_value_len), iVar1 == 0)) ||
                             (iVar1 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20),
                             iVar1 == 0)) break;
                          uVar17 = uVar18;
                          puVar12 = puVar11;
                          if (uVar18 == 0) {
                            iVar1 = _libssh2_sha256_update(&hash,"F",1);
                            if (iVar1 == 0) break;
                            uVar17 = (ulong)session->session_id_len;
                            puVar12 = session->session_id;
                          }
                          iVar1 = _libssh2_sha256_update(&hash,puVar12,uVar17);
                          if (iVar1 == 0) break;
                          iVar1 = _libssh2_sha256_final(&hash,puVar11 + uVar18);
                          uVar18 = uVar18 + 0x20;
                        } while (iVar1 != 0);
                        goto LAB_00112954;
                      }
                    }
                    puVar11 = (uchar *)0x0;
LAB_00112960:
                    if (puVar11 == (uchar *)0x0) goto LAB_00112a7c;
                    (*((session->remote).mac)->init)
                              (session,puVar11,(int *)&server_public_key,
                               &(session->remote).mac_abstract);
                    if ((int)server_public_key != 0) {
                      explicit_bzero(puVar11,(long)((session->remote).mac)->key_len);
                      (*session->free)(puVar11,&session->abstract);
                    }
                  }
                  pLVar15 = (session->local).comp;
                  if (pLVar15 != (LIBSSH2_COMP_METHOD *)0x0) {
                    if (pLVar15->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                      (*pLVar15->dtor)(session,1,&(session->local).comp_abstract);
                      pLVar15 = (session->local).comp;
                      if (pLVar15 == (LIBSSH2_COMP_METHOD *)0x0) goto LAB_001129fe;
                    }
                    if ((pLVar15->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) &&
                       (iVar1 = (*pLVar15->init)(session,1,&(session->local).comp_abstract),
                       iVar1 != 0)) goto LAB_00111be1;
                  }
LAB_001129fe:
                  pLVar15 = (session->remote).comp;
                  iVar1 = 0;
                  if (pLVar15 != (LIBSSH2_COMP_METHOD *)0x0) {
                    if (pLVar15->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                      iVar1 = 0;
                      (*pLVar15->dtor)(session,0,&(session->remote).comp_abstract);
                      pLVar15 = (session->remote).comp;
                      if (pLVar15 == (LIBSSH2_COMP_METHOD *)0x0) goto switchD_00110958_caseD_1;
                    }
                    iVar1 = 0;
                    if (pLVar15->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                      iVar1 = (*pLVar15->init)(session,0,&(session->remote).comp_abstract);
                      iVar1 = (uint)(iVar1 == 0) * 5 + -5;
                    }
                  }
                }
                else {
                  iVar1 = -1;
                  server_public_key._0_4_ = 0;
                  server_public_key_len._0_4_ = 0;
                  if (type == LIBSSH2_EC_CURVE_NISTP256) {
                    puVar11 = (uchar *)(*session->alloc)((long)pLVar13->iv_len + 0x20,
                                                         &session->abstract);
                    if (puVar11 == (uchar *)0x0) goto LAB_0011189b;
                    uVar18 = 0;
                    do {
                      if ((ulong)(long)((session->local).crypt)->iv_len <= uVar18)
                      goto LAB_0011189e;
                      iVar7 = _libssh2_sha256_init(&hash);
                      if (((iVar7 == 0) ||
                          (iVar7 = _libssh2_sha256_update
                                             (&hash,exchange_state->k_value,
                                              exchange_state->k_value_len), iVar7 == 0)) ||
                         (iVar7 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20),
                         iVar7 == 0)) break;
                      uVar17 = uVar18;
                      puVar12 = puVar11;
                      if (uVar18 == 0) {
                        iVar7 = _libssh2_sha256_update(&hash,"A",1);
                        if (iVar7 == 0) break;
                        uVar17 = (ulong)session->session_id_len;
                        puVar12 = session->session_id;
                      }
                      iVar7 = _libssh2_sha256_update(&hash,puVar12,uVar17);
                      if (iVar7 == 0) break;
                      iVar7 = _libssh2_sha256_final(&hash,puVar11 + uVar18);
                      uVar18 = uVar18 + 0x20;
                    } while (iVar7 != 0);
LAB_00111889:
                    (*session->free)(puVar11,&session->abstract);
                    puVar11 = (uchar *)0x0;
                  }
                  else {
                    if (type == LIBSSH2_EC_CURVE_NISTP521) {
                      puVar11 = (uchar *)(*session->alloc)((long)pLVar13->iv_len + 0x40,
                                                           &session->abstract);
                      if (puVar11 != (uchar *)0x0) {
                        local_68 = exchange_state->h_sig_comp;
                        uVar18 = 0;
                        do {
                          if ((ulong)(long)((session->local).crypt)->iv_len <= uVar18)
                          goto LAB_0011189e;
                          iVar7 = _libssh2_sha512_init(&hash);
                          if (((iVar7 == 0) ||
                              (iVar7 = _libssh2_sha512_update
                                                 (&hash,exchange_state->k_value,
                                                  exchange_state->k_value_len), iVar7 == 0)) ||
                             (iVar7 = _libssh2_sha512_update(&hash,local_68,0x40), iVar7 == 0))
                          break;
                          uVar17 = uVar18;
                          puVar12 = puVar11;
                          if (uVar18 == 0) {
                            iVar7 = _libssh2_sha512_update(&hash,"A",1);
                            if (iVar7 == 0) break;
                            uVar17 = (ulong)session->session_id_len;
                            puVar12 = session->session_id;
                          }
                          iVar7 = _libssh2_sha512_update(&hash,puVar12,uVar17);
                          if (iVar7 == 0) break;
                          iVar7 = _libssh2_sha512_final(&hash,puVar11 + uVar18);
                          uVar18 = uVar18 + 0x40;
                        } while (iVar7 != 0);
                        goto LAB_00111889;
                      }
                    }
                    else {
                      if (type != LIBSSH2_EC_CURVE_NISTP384) goto switchD_00110958_caseD_1;
                      puVar11 = (uchar *)(*session->alloc)((long)pLVar13->iv_len + 0x30,
                                                           &session->abstract);
                      if (puVar11 != (uchar *)0x0) {
                        local_68 = exchange_state->h_sig_comp;
                        uVar18 = 0;
                        do {
                          if ((ulong)(long)((session->local).crypt)->iv_len <= uVar18)
                          goto LAB_0011189e;
                          iVar7 = _libssh2_sha384_init(&hash);
                          if (((iVar7 == 0) ||
                              (iVar7 = _libssh2_sha384_update
                                                 (&hash,exchange_state->k_value,
                                                  exchange_state->k_value_len), iVar7 == 0)) ||
                             (iVar7 = _libssh2_sha384_update(&hash,local_68,0x30), iVar7 == 0))
                          break;
                          uVar17 = uVar18;
                          puVar12 = puVar11;
                          if (uVar18 == 0) {
                            iVar7 = _libssh2_sha384_update(&hash,"A",1);
                            if (iVar7 == 0) break;
                            uVar17 = (ulong)session->session_id_len;
                            puVar12 = session->session_id;
                          }
                          iVar7 = _libssh2_sha384_update(&hash,puVar12,uVar17);
                          if (iVar7 == 0) break;
                          iVar7 = _libssh2_sha384_final(&hash,puVar11 + uVar18);
                          uVar18 = uVar18 + 0x30;
                        } while (iVar7 != 0);
                        goto LAB_00111889;
                      }
                    }
LAB_0011189b:
                    puVar11 = (uchar *)0x0;
                  }
LAB_0011189e:
                  if (puVar11 == (uchar *)0x0) goto switchD_00110958_caseD_1;
                  if (type == LIBSSH2_EC_CURVE_NISTP256) {
                    puVar12 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len
                                                         + 0x20,&session->abstract);
                    if (puVar12 == (uchar *)0x0) goto LAB_00111b93;
                    uVar18 = 0;
                    do {
                      if ((ulong)(long)((session->local).crypt)->secret_len <= uVar18)
                      goto LAB_00111b96;
                      iVar1 = _libssh2_sha256_init(&hash);
                      if (((iVar1 == 0) ||
                          (iVar1 = _libssh2_sha256_update
                                             (&hash,exchange_state->k_value,
                                              exchange_state->k_value_len), iVar1 == 0)) ||
                         (iVar1 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20),
                         iVar1 == 0)) break;
                      uVar17 = uVar18;
                      puVar19 = puVar12;
                      if (uVar18 == 0) {
                        iVar1 = _libssh2_sha256_update(&hash,"C",1);
                        if (iVar1 == 0) break;
                        uVar17 = (ulong)session->session_id_len;
                        puVar19 = session->session_id;
                      }
                      iVar1 = _libssh2_sha256_update(&hash,puVar19,uVar17);
                      if (iVar1 == 0) break;
                      iVar1 = _libssh2_sha256_final(&hash,puVar12 + uVar18);
                      uVar18 = uVar18 + 0x20;
                    } while (iVar1 != 0);
LAB_00111b81:
                    (*session->free)(puVar12,&session->abstract);
                    puVar12 = (uchar *)0x0;
LAB_00111b96:
                    if (puVar12 != (uchar *)0x0) {
                      pLVar13 = (session->local).crypt;
                      iVar1 = (*pLVar13->init)(session,pLVar13,puVar11,(int *)&server_public_key,
                                               puVar12,(int *)&server_public_key_len,1,
                                               &(session->local).crypt_abstract);
                      if (iVar1 == 0) {
                        if ((int)server_public_key != 0) {
                          explicit_bzero(puVar11,(long)((session->local).crypt)->iv_len);
                          (*session->free)(puVar11,&session->abstract);
                        }
                        if ((uint32_t)server_public_key_len != 0) {
                          explicit_bzero(puVar12,(long)((session->local).crypt)->secret_len);
                          (*session->free)(puVar12,&session->abstract);
                        }
                        goto LAB_00111c30;
                      }
                      (*session->free)(puVar11,&session->abstract);
                      puVar11 = puVar12;
                    }
                  }
                  else {
                    if (type == LIBSSH2_EC_CURVE_NISTP521) {
                      puVar12 = (uchar *)(*session->alloc)((long)((session->local).crypt)->
                                                                 secret_len + 0x40,
                                                           &session->abstract);
                      if (puVar12 != (uchar *)0x0) {
                        uVar18 = 0;
                        do {
                          if ((ulong)(long)((session->local).crypt)->secret_len <= uVar18)
                          goto LAB_00111b96;
                          iVar1 = _libssh2_sha512_init(&hash);
                          if (((iVar1 == 0) ||
                              (iVar1 = _libssh2_sha512_update
                                                 (&hash,exchange_state->k_value,
                                                  exchange_state->k_value_len), iVar1 == 0)) ||
                             (iVar1 = _libssh2_sha512_update(&hash,exchange_state->h_sig_comp,0x40),
                             iVar1 == 0)) break;
                          uVar17 = uVar18;
                          puVar19 = puVar12;
                          if (uVar18 == 0) {
                            iVar1 = _libssh2_sha512_update(&hash,"C",1);
                            if (iVar1 == 0) break;
                            uVar17 = (ulong)session->session_id_len;
                            puVar19 = session->session_id;
                          }
                          iVar1 = _libssh2_sha512_update(&hash,puVar19,uVar17);
                          if (iVar1 == 0) break;
                          iVar1 = _libssh2_sha512_final(&hash,puVar12 + uVar18);
                          uVar18 = uVar18 + 0x40;
                        } while (iVar1 != 0);
                        goto LAB_00111b81;
                      }
LAB_00111b93:
                      puVar12 = (uchar *)0x0;
                      goto LAB_00111b96;
                    }
                    if (type == LIBSSH2_EC_CURVE_NISTP384) {
                      puVar12 = (uchar *)(*session->alloc)((long)((session->local).crypt)->
                                                                 secret_len + 0x30,
                                                           &session->abstract);
                      if (puVar12 != (uchar *)0x0) {
                        uVar18 = 0;
                        do {
                          if ((ulong)(long)((session->local).crypt)->secret_len <= uVar18)
                          goto LAB_00111b96;
                          iVar1 = _libssh2_sha384_init(&hash);
                          if (((iVar1 == 0) ||
                              (iVar1 = _libssh2_sha384_update
                                                 (&hash,exchange_state->k_value,
                                                  exchange_state->k_value_len), iVar1 == 0)) ||
                             (iVar1 = _libssh2_sha384_update(&hash,exchange_state->h_sig_comp,0x30),
                             iVar1 == 0)) break;
                          uVar17 = uVar18;
                          puVar19 = puVar12;
                          if (uVar18 == 0) {
                            iVar1 = _libssh2_sha384_update(&hash,"C",1);
                            if (iVar1 == 0) break;
                            uVar17 = (ulong)session->session_id_len;
                            puVar19 = session->session_id;
                          }
                          iVar1 = _libssh2_sha384_update(&hash,puVar19,uVar17);
                          if (iVar1 == 0) break;
                          iVar1 = _libssh2_sha384_final(&hash,puVar12 + uVar18);
                          uVar18 = uVar18 + 0x30;
                        } while (iVar1 != 0);
                        goto LAB_00111b81;
                      }
                      goto LAB_00111b93;
                    }
                  }
                  (*session->free)(puVar11,&session->abstract);
LAB_00111be1:
                  iVar1 = -5;
                }
                goto switchD_00110958_caseD_1;
              }
              pcVar16 = "Timed out waiting for NEWKEYS ECDH";
            }
            else {
              pcVar16 = "Unable to send NEWKEYS message ECDH";
            }
            goto LAB_001114f7;
          }
          pcVar16 = "Unable to create ECDH shared secret";
          iVar1 = -5;
        }
        else {
          pcVar16 = "Unexpected ECDH server sig length";
          iVar1 = -10;
        }
        iVar1 = _libssh2_error(session,iVar1,pcVar16);
        goto switchD_00110958_caseD_1;
      }
      pcVar16 = "Unexpected key length ECDH";
      iVar1 = -0xe;
    }
    else {
      pcVar16 = "Unable to initialize hostkey importer ECDH";
      iVar1 = -10;
    }
  }
  else {
    pcVar16 = "Unable to allocate memory for a copy of the host ECDH key";
LAB_001109ad:
    iVar1 = -6;
  }
LAB_001114f7:
  iVar1 = _libssh2_error(session,iVar1,pcVar16);
switchD_00110958_caseD_1:
  ecdh_exchange_state_cleanup(session,exchange_state);
  return iVar1;
}

Assistant:

static int ecdh_sha2_nistp(LIBSSH2_SESSION *session, libssh2_curve_type type,
                           unsigned char *data, size_t data_len,
                           unsigned char *public_key,
                           size_t public_key_len, _libssh2_ec_key *private_key,
                           kmdhgGPshakex_state_t *exchange_state)
{
    int ret = 0;
    int rc;

    if(data_len < 5) {
        ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                             "Host key data is too short");
        return ret;
    }

    if(exchange_state->state == libssh2_NB_state_idle) {

        /* Setup initial values */
        exchange_state->k = _libssh2_bn_init();

        exchange_state->state = libssh2_NB_state_created;
    }

    if(exchange_state->state == libssh2_NB_state_created) {
        /* parse INIT reply data */

        /* host key K_S */
        unsigned char *server_public_key;
        size_t server_public_key_len;
        struct string_buf buf;

        buf.data = data;
        buf.len = data_len;
        buf.dataptr = buf.data;
        buf.dataptr++; /* Advance past packet type */

        if(_libssh2_copy_string(session, &buf, &(session->server_hostkey),
                                &server_public_key_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate memory for a copy "
                                 "of the host ECDH key");
            goto clean_exit;
        }

        session->server_hostkey_len = (uint32_t)server_public_key_len;

#if LIBSSH2_MD5
        {
            libssh2_md5_ctx fingerprint_ctx;

            if(libssh2_md5_init(&fingerprint_ctx) &&
               libssh2_md5_update(fingerprint_ctx, session->server_hostkey,
                                  session->server_hostkey_len) &&
               libssh2_md5_final(fingerprint_ctx,
                                 session->server_hostkey_md5)) {
                session->server_hostkey_md5_valid = TRUE;
            }
            else {
                session->server_hostkey_md5_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[50], *fprint = fingerprint;
            int i;
            for(i = 0; i < 16; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_md5[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's MD5 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */
#endif /* ! LIBSSH2_MD5 */

        {
            libssh2_sha1_ctx fingerprint_ctx;

            if(libssh2_sha1_init(&fingerprint_ctx) &&
               libssh2_sha1_update(fingerprint_ctx, session->server_hostkey,
                                   session->server_hostkey_len) &&
               libssh2_sha1_final(fingerprint_ctx,
                                  session->server_hostkey_sha1)) {
                session->server_hostkey_sha1_valid = TRUE;
            }
            else {
                session->server_hostkey_sha1_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[64], *fprint = fingerprint;
            int i;
            for(i = 0; i < 20; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_sha1[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's SHA1 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */

        /* SHA256 */
        {
            libssh2_sha256_ctx fingerprint_ctx;

            if(libssh2_sha256_init(&fingerprint_ctx) &&
               libssh2_sha256_update(fingerprint_ctx, session->server_hostkey,
                                     session->server_hostkey_len) &&
               libssh2_sha256_final(fingerprint_ctx,
                                    session->server_hostkey_sha256)) {
                session->server_hostkey_sha256_valid = TRUE;
            }
            else {
                session->server_hostkey_sha256_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char *base64Fingerprint = NULL;
            _libssh2_base64_encode(session,
                                   (const char *)
                                   session->server_hostkey_sha256,
                                   SHA256_DIGEST_LENGTH, &base64Fingerprint);
            if(base64Fingerprint) {
                _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                               "Server's SHA256 Fingerprint: %s",
                               base64Fingerprint));
                LIBSSH2_FREE(session, base64Fingerprint);
            }
        }
#endif /* LIBSSH2DEBUG */

        if(session->hostkey->init(session, session->server_hostkey,
                                  session->server_hostkey_len,
                                  &session->server_hostkey_abstract)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unable to initialize hostkey importer "
                                 "ECDH");
            goto clean_exit;
        }

        /* server public key Q_S */
        if(_libssh2_get_string(&buf, &server_public_key,
                               &server_public_key_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected key length ECDH");
            goto clean_exit;
        }

        /* server signature */
        if(_libssh2_get_string(&buf, &exchange_state->h_sig,
           &(exchange_state->h_sig_len))) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unexpected ECDH server sig length");
            goto clean_exit;
        }

        /* Compute the shared secret K */
        rc = _libssh2_ecdh_gen_k(&exchange_state->k, private_key,
                                 server_public_key, server_public_key_len);
        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_KEX_FAILURE,
                                 "Unable to create ECDH shared secret");
            goto clean_exit;
        }

        exchange_state->k_value_len = _libssh2_bn_bytes(exchange_state->k) + 5;
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            /* don't need leading 00 */
            exchange_state->k_value_len--;
        }
        exchange_state->k_value =
        LIBSSH2_ALLOC(session, exchange_state->k_value_len);
        if(!exchange_state->k_value) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate buffer for ECDH K");
            goto clean_exit;
        }
        _libssh2_htonu32(exchange_state->k_value,
                         (uint32_t)(exchange_state->k_value_len - 4));
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            if(_libssh2_bn_to_bin(exchange_state->k,
                                  exchange_state->k_value + 4)) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_OUT_OF_BOUNDARY,
                                     "Can't write exchange_state->k");
                goto clean_exit;
            }
        }
        else {
            exchange_state->k_value[4] = 0;
            if(_libssh2_bn_to_bin(exchange_state->k,
                                  exchange_state->k_value + 5)) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_OUT_OF_BOUNDARY,
                                     "Can't write exchange_state->e");
                goto clean_exit;
            }
        }

        /* verify hash */

        switch(type) {
            case LIBSSH2_EC_CURVE_NISTP256:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(256);
                break;
            case LIBSSH2_EC_CURVE_NISTP384:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(384);
                break;
            case LIBSSH2_EC_CURVE_NISTP521:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(512);
                break;
        }

        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_SIGN,
                                 "Unable to verify hostkey signature "
                                 "ECDH");
            goto clean_exit;
        }

        exchange_state->c = SSH_MSG_NEWKEYS;
        exchange_state->state = libssh2_NB_state_sent;
    }

    if(exchange_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, &exchange_state->c, 1, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send NEWKEYS message ECDH");
            goto clean_exit;
        }

        exchange_state->state = libssh2_NB_state_sent2;
    }

    if(exchange_state->state == libssh2_NB_state_sent2) {
        rc = _libssh2_packet_require(session, SSH_MSG_NEWKEYS,
                                     &exchange_state->tmp,
                                     &exchange_state->tmp_len, 0, NULL, 0,
                                     &exchange_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timed out waiting for NEWKEYS ECDH");
            goto clean_exit;
        }

        /* The first key exchange has been performed,
           switch to active crypt/comp/mac mode */
        session->state |= LIBSSH2_STATE_NEWKEYS;
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Received NEWKEYS message ECDH"));

        /* This will actually end up being just packet_type(1)
           for this packet type anyway */
        LIBSSH2_FREE(session, exchange_state->tmp);

        if(!session->session_id) {

            size_t digest_length = 0;

            if(type == LIBSSH2_EC_CURVE_NISTP256)
                digest_length = SHA256_DIGEST_LENGTH;
            else if(type == LIBSSH2_EC_CURVE_NISTP384)
                digest_length = SHA384_DIGEST_LENGTH;
            else if(type == LIBSSH2_EC_CURVE_NISTP521)
                digest_length = SHA512_DIGEST_LENGTH;
            else{
                ret = _libssh2_error(session, LIBSSH2_ERROR_KEX_FAILURE,
                                     "Unknown SHA digest for EC curve");
                goto clean_exit;

            }
            session->session_id = LIBSSH2_ALLOC(session, digest_length);
            if(!session->session_id) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                     "Unable to allocate buffer for "
                                     "SHA digest");
                goto clean_exit;
            }
            memcpy(session->session_id, exchange_state->h_sig_comp,
                   digest_length);
             session->session_id_len = (uint32_t)digest_length;
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "session_id calculated"));
        }

        /* Cleanup any existing cipher */
        if(session->local.crypt->dtor) {
            session->local.crypt->dtor(session,
                                       &session->local.crypt_abstract);
        }

        /* Calculate IV/Secret/Key for each direction */
        if(session->local.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(iv,
                                                 session->local.crypt->
                                                 iv_len, "A");
            if(!iv) {
                ret = -1;
                goto clean_exit;
            }

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(secret,
                                                 session->local.crypt->
                                                 secret_len, "C");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->local.crypt->
                init(session, session->local.crypt, iv, &free_iv, secret,
                     &free_secret, 1, &session->local.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->local.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->local.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server IV and Key calculated"));

        if(session->remote.crypt->dtor) {
            /* Cleanup any existing cipher */
            session->remote.crypt->dtor(session,
                                        &session->remote.crypt_abstract);
        }

        if(session->remote.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(iv,
                                                 session->remote.crypt->
                                                 iv_len, "B");

            if(!iv) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(secret,
                                                 session->remote.crypt->
                                                 secret_len, "D");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->remote.crypt->
                init(session, session->remote.crypt, iv, &free_iv, secret,
                     &free_secret, 0, &session->remote.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->remote.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->remote.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client IV and Key calculated"));

        if(session->local.mac->dtor) {
            session->local.mac->dtor(session, &session->local.mac_abstract);
        }

        if(session->local.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(key,
                                                 session->local.mac->
                                                 key_len, "E");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->local.mac->init(session, key, &free_key,
                                     &session->local.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->local.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server HMAC Key calculated"));

        if(session->remote.mac->dtor) {
            session->remote.mac->dtor(session, &session->remote.mac_abstract);
        }

        if(session->remote.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(key,
                                                 session->remote.mac->
                                                 key_len, "F");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->remote.mac->init(session, key, &free_key,
                                      &session->remote.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->remote.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client HMAC Key calculated"));

        /* Initialize compression for each direction */

        /* Cleanup any existing compression */
        if(session->local.comp && session->local.comp->dtor) {
            session->local.comp->dtor(session, 1,
                                      &session->local.comp_abstract);
        }

        if(session->local.comp && session->local.comp->init) {
            if(session->local.comp->init(session, 1,
                                         &session->local.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server compression initialized"));

        if(session->remote.comp && session->remote.comp->dtor) {
            session->remote.comp->dtor(session, 0,
                                       &session->remote.comp_abstract);
        }

        if(session->remote.comp && session->remote.comp->init) {
            if(session->remote.comp->init(session, 0,
                                          &session->remote.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client compression initialized"));
    }

clean_exit:
    ecdh_exchange_state_cleanup(session, exchange_state);

    return ret;
}